

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkhash.c
# Opt level: O0

lh_entry * lh_table_lookup_entry_w_hash(lh_table *t,void *k,unsigned_long h)

{
  int iVar1;
  int local_34;
  ulong uStack_30;
  int count;
  unsigned_long n;
  unsigned_long h_local;
  void *k_local;
  lh_table *t_local;
  
  uStack_30 = h % (ulong)(long)t->size;
  local_34 = 0;
  while( true ) {
    if (t->size <= local_34) {
      return (lh_entry *)0x0;
    }
    if (t->table[uStack_30].k == (void *)0xffffffffffffffff) break;
    if ((t->table[uStack_30].k != (void *)0xfffffffffffffffe) &&
       (iVar1 = (*t->equal_fn)(t->table[uStack_30].k,k), iVar1 != 0)) {
      return t->table + uStack_30;
    }
    uStack_30 = uStack_30 + 1;
    if ((int)uStack_30 == t->size) {
      uStack_30 = 0;
    }
    local_34 = local_34 + 1;
  }
  return (lh_entry *)0x0;
}

Assistant:

struct lh_entry *lh_table_lookup_entry_w_hash(struct lh_table *t, const void *k,
                                              const unsigned long h)
{
	unsigned long n = h % t->size;
	int count = 0;

	while (count < t->size)
	{
		if (t->table[n].k == LH_EMPTY)
			return NULL;
		if (t->table[n].k != LH_FREED && t->equal_fn(t->table[n].k, k))
			return &t->table[n];
		if ((int)++n == t->size)
			n = 0;
		count++;
	}
	return NULL;
}